

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell::
~TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell
          (TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MinipointCounterTest, OwnAndRoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(24, m.total(false));
}